

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O3

int hello_world_class_impl_interface_static_set
              (klass cls,class_impl impl,accessor_type *accessor,value v)

{
  char cVar1;
  undefined4 uVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  char *message;
  AssertHelper local_48;
  Message local_40;
  internal local_38 [8];
  undefined8 *local_30;
  
  pcVar3 = (accessor->data).key;
  local_40.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
  local_48.data_ = (AssertHelperData *)impl;
  testing::internal::CmpHelperNE<void*,void*>
            (local_38,"(void *)__null","(void *)hello_world",(void **)&local_40,&local_48.data_);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message(&local_40);
    if (local_30 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_30;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
               ,0xf7,message);
    testing::internal::AssertHelper::operator=(&local_48,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_40.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_40.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_30 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_30 != local_30 + 2) {
      operator_delete((undefined8 *)*local_30);
    }
    operator_delete(local_30);
  }
  pcVar3 = (char *)attribute_name(pcVar3);
  if (pcVar3 == (char *)0x0) {
    iVar5 = 1;
  }
  else {
    cVar1 = *pcVar3;
    iVar4 = 0;
    iVar5 = iVar4;
    if (cVar1 == 'c') {
      if (pcVar3[1] == '\0') {
        pcVar3 = (char *)value_to_string(v);
        strncpy((char *)((long)impl + 8),pcVar3,9);
      }
    }
    else if (cVar1 == 'b') {
      if (pcVar3[1] == '\0') {
        uVar2 = value_to_float(v);
        *(undefined4 *)((long)impl + 4) = uVar2;
      }
    }
    else {
      iVar5 = 0;
      if ((cVar1 == 'a') && (iVar5 = iVar4, pcVar3[1] == '\0')) {
        uVar2 = value_to_int(v);
        *(undefined4 *)impl = uVar2;
      }
    }
  }
  return iVar5;
}

Assistant:

int hello_world_class_impl_interface_static_set(klass cls, class_impl impl, struct accessor_type *accessor, value v)
{
	hello_world_class hello_world = (hello_world_class)impl;
	attribute attr = accessor->data.attr;

	EXPECT_NE((void *)NULL, (void *)hello_world);

	(void)cls;

	char *key = attribute_name(attr);

	if (key == NULL)
	{
		return 1;
	}

	// Horrible but it is just a ilustrative example
	if (strcmp(key, "a") == 0)
	{
		hello_world->a = value_to_int(v);
	}
	else if (strcmp(key, "b") == 0)
	{
		hello_world->b = value_to_float(v);
	}
	else if (strcmp(key, "c") == 0)
	{
		strncpy(hello_world->c, value_to_string(v), 9);
	}

	return 0;
}